

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O1

void anon_unknown.dwarf_22b41::verifyLevelsAreEqual
               (DeepImageLevel *level1,DeepImageLevel *level2,int dx,int dy)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  _Base_ptr __n;
  undefined8 *puVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  _Rb_tree_node_base *p_Var13;
  ostream *poVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ArgExc *this;
  ulong uVar19;
  int iVar20;
  
  if ((((*(int *)(level1 + 0x18) == *(int *)(level2 + 0x18) - dx) &&
       (*(int *)(level1 + 0x1c) == *(int *)(level2 + 0x1c) - dy)) &&
      (*(int *)(level1 + 0x20) == *(int *)(level2 + 0x20) - dx)) &&
     (*(int *)(level1 + 0x24) == *(int *)(level2 + 0x24) - dy)) {
    p_Var11 = (_Rb_tree_node_base *)Imf_3_2::DeepImageLevel::begin();
    p_Var12 = (_Rb_tree_node_base *)Imf_3_2::DeepImageLevel::begin();
    p_Var13 = (_Rb_tree_node_base *)Imf_3_2::DeepImageLevel::end();
    if (p_Var11 != p_Var13) {
      do {
        p_Var13 = (_Rb_tree_node_base *)Imf_3_2::DeepImageLevel::end();
        if (p_Var12 == p_Var13) break;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"            channel ",0x14);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,*(char **)(p_Var11 + 1),
                             (long)p_Var11[1]._M_parent);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
        __n = p_Var11[1]._M_parent;
        if ((__n != p_Var12[1]._M_parent) ||
           ((__n != (_Base_ptr)0x0 &&
            (iVar9 = bcmp(*(void **)(p_Var11 + 1),*(void **)(p_Var12 + 1),(size_t)__n), iVar9 != 0))
           )) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(this,"different channel names");
          goto LAB_0010cab7;
        }
        iVar9 = (**(code **)**(undefined8 **)(p_Var11 + 2))();
        iVar10 = (**(code **)**(undefined8 **)(p_Var12 + 2))();
        if (iVar9 != iVar10) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(this,"different channel types");
          goto LAB_0010cab7;
        }
        puVar4 = *(undefined8 **)(p_Var11 + 2);
        lVar5 = *(long *)(p_Var12 + 2);
        if ((*(int *)(puVar4 + 2) != *(int *)(lVar5 + 0x10)) ||
           (*(int *)((long)puVar4 + 0x14) != *(int *)(lVar5 + 0x14))) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(this,"different channel sampling rates");
          goto LAB_0010cab7;
        }
        if (*(char *)(puVar4 + 3) != *(char *)(lVar5 + 0x18)) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(this,"different channel types");
          goto LAB_0010cab7;
        }
        iVar9 = (**(code **)*puVar4)();
        if (iVar9 == 0) {
          lVar5 = *(long *)(p_Var11 + 2);
          uVar6 = *(undefined8 *)(p_Var12 + 2);
          lVar15 = __dynamic_cast(lVar5,&Imf_3_2::DeepImageChannel::typeinfo,
                                  &Imf_3_2::TypedDeepImageChannel<unsigned_int>::typeinfo,0);
          if ((lVar15 == 0) ||
             (lVar16 = __dynamic_cast(uVar6,&Imf_3_2::DeepImageChannel::typeinfo,
                                      &Imf_3_2::TypedDeepImageChannel<unsigned_int>::typeinfo,0),
             lVar16 == 0)) {
LAB_0010cb48:
            __cxa_bad_cast();
          }
          lVar5 = *(long *)(lVar5 + 8);
          lVar17 = Imf_3_2::DeepImageChannel::deepLevel();
          lVar18 = Imf_3_2::DeepImageChannel::deepLevel();
          if (*(int *)(lVar5 + 0x1c) <= *(int *)(lVar5 + 0x24)) {
            iVar9 = *(int *)(lVar5 + 0x1c);
            do {
              if (*(int *)(lVar5 + 0x18) <= *(int *)(lVar5 + 0x20)) {
                iVar10 = *(int *)(lVar5 + 0x18);
                do {
                  Imf_3_2::ImageChannel::boundsCheck((int)lVar17 + 0x58,iVar10);
                  uVar3 = *(uint *)(*(long *)(lVar17 + 0x90) +
                                   (long)(*(int *)(lVar17 + 0x74) * iVar9 + iVar10) * 4);
                  iVar20 = iVar10 + dx;
                  Imf_3_2::ImageChannel::boundsCheck((int)lVar18 + 0x58,iVar20);
                  if (uVar3 != *(uint *)(*(long *)(lVar18 + 0x90) +
                                        (long)(*(int *)(lVar18 + 0x74) * (dy + iVar9) + iVar20) * 4)
                     ) {
                    this = (ArgExc *)__cxa_allocate_exception(0x48);
                    Iex_3_2::ArgExc::ArgExc(this,"different pixel sample counts");
                    goto LAB_0010cab7;
                  }
                  Imf_3_2::ImageChannel::boundsCheck((int)lVar15,iVar10);
                  lVar7 = *(long *)(*(long *)(lVar15 + 0x38) +
                                   (long)(*(int *)(lVar15 + 0x1c) * iVar9 + iVar10) * 8);
                  Imf_3_2::ImageChannel::boundsCheck((int)lVar16,iVar20);
                  if (0 < (int)uVar3) {
                    uVar19 = 0;
                    do {
                      if (*(int *)(lVar7 + uVar19 * 4) !=
                          *(int *)(*(long *)(*(long *)(lVar16 + 0x38) +
                                            (long)(*(int *)(lVar16 + 0x1c) * (dy + iVar9) + iVar20)
                                            * 8) + uVar19 * 4)) {
                        this = (ArgExc *)__cxa_allocate_exception(0x48);
                        Iex_3_2::ArgExc::ArgExc(this,"different sample values");
                        goto LAB_0010cab7;
                      }
                      uVar19 = uVar19 + 1;
                    } while (uVar3 != uVar19);
                  }
                  bVar8 = iVar10 < *(int *)(lVar5 + 0x20);
                  iVar10 = iVar10 + 1;
                } while (bVar8);
              }
              bVar8 = iVar9 < *(int *)(lVar5 + 0x24);
              iVar9 = iVar9 + 1;
            } while (bVar8);
          }
        }
        else if (iVar9 == 2) {
          lVar5 = *(long *)(p_Var11 + 2);
          uVar6 = *(undefined8 *)(p_Var12 + 2);
          lVar15 = __dynamic_cast(lVar5,&Imf_3_2::DeepImageChannel::typeinfo,
                                  &Imf_3_2::TypedDeepImageChannel<float>::typeinfo,0);
          if ((lVar15 == 0) ||
             (lVar16 = __dynamic_cast(uVar6,&Imf_3_2::DeepImageChannel::typeinfo,
                                      &Imf_3_2::TypedDeepImageChannel<float>::typeinfo,0),
             lVar16 == 0)) goto LAB_0010cb48;
          lVar5 = *(long *)(lVar5 + 8);
          lVar17 = Imf_3_2::DeepImageChannel::deepLevel();
          lVar18 = Imf_3_2::DeepImageChannel::deepLevel();
          if (*(int *)(lVar5 + 0x1c) <= *(int *)(lVar5 + 0x24)) {
            iVar9 = *(int *)(lVar5 + 0x1c);
            do {
              if (*(int *)(lVar5 + 0x18) <= *(int *)(lVar5 + 0x20)) {
                iVar10 = *(int *)(lVar5 + 0x18);
                do {
                  Imf_3_2::ImageChannel::boundsCheck((int)lVar17 + 0x58,iVar10);
                  uVar3 = *(uint *)(*(long *)(lVar17 + 0x90) +
                                   (long)(*(int *)(lVar17 + 0x74) * iVar9 + iVar10) * 4);
                  iVar20 = iVar10 + dx;
                  Imf_3_2::ImageChannel::boundsCheck((int)lVar18 + 0x58,iVar20);
                  if (uVar3 != *(uint *)(*(long *)(lVar18 + 0x90) +
                                        (long)(*(int *)(lVar18 + 0x74) * (dy + iVar9) + iVar20) * 4)
                     ) {
                    this = (ArgExc *)__cxa_allocate_exception(0x48);
                    Iex_3_2::ArgExc::ArgExc(this,"different pixel sample counts");
                    goto LAB_0010cab7;
                  }
                  Imf_3_2::ImageChannel::boundsCheck((int)lVar15,iVar10);
                  lVar7 = *(long *)(*(long *)(lVar15 + 0x38) +
                                   (long)(*(int *)(lVar15 + 0x1c) * iVar9 + iVar10) * 8);
                  Imf_3_2::ImageChannel::boundsCheck((int)lVar16,iVar20);
                  if (0 < (int)uVar3) {
                    uVar19 = 0;
                    do {
                      fVar2 = *(float *)(lVar7 + uVar19 * 4);
                      pfVar1 = (float *)(*(long *)(*(long *)(lVar16 + 0x38) +
                                                  (long)(*(int *)(lVar16 + 0x1c) * (dy + iVar9) +
                                                        iVar20) * 8) + uVar19 * 4);
                      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                        this = (ArgExc *)__cxa_allocate_exception(0x48);
                        Iex_3_2::ArgExc::ArgExc(this,"different sample values");
                        goto LAB_0010cab7;
                      }
                      uVar19 = uVar19 + 1;
                    } while (uVar3 != uVar19);
                  }
                  bVar8 = iVar10 < *(int *)(lVar5 + 0x20);
                  iVar10 = iVar10 + 1;
                } while (bVar8);
              }
              bVar8 = iVar9 < *(int *)(lVar5 + 0x24);
              iVar9 = iVar9 + 1;
            } while (bVar8);
          }
        }
        else {
          if (iVar9 != 1) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                          ,0x72,
                          "void (anonymous namespace)::verifyLevelsAreEqual(const DeepImageLevel &, const DeepImageLevel &, int, int)"
                         );
          }
          verifyPixelsAreEqual<Imath_3_2::half>
                    (*(DeepImageChannel **)(p_Var11 + 2),*(DeepImageChannel **)(p_Var12 + 2),dx,dy);
        }
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
        p_Var13 = (_Rb_tree_node_base *)Imf_3_2::DeepImageLevel::end();
      } while (p_Var11 != p_Var13);
    }
    p_Var13 = (_Rb_tree_node_base *)Imf_3_2::DeepImageLevel::end();
    if ((p_Var11 == p_Var13) &&
       (p_Var11 = (_Rb_tree_node_base *)Imf_3_2::DeepImageLevel::end(), p_Var12 == p_Var11)) {
      return;
    }
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(this,"different channel lists");
  }
  else {
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(this,"different data windows");
  }
LAB_0010cab7:
  __cxa_throw(this,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
verifyLevelsAreEqual (
    const DeepImageLevel& level1, const DeepImageLevel& level2, int dx, int dy)
{
    if (level1.dataWindow ().min.x != level2.dataWindow ().min.x - dx ||
        level1.dataWindow ().min.y != level2.dataWindow ().min.y - dy ||
        level1.dataWindow ().max.x != level2.dataWindow ().max.x - dx ||
        level1.dataWindow ().max.y != level2.dataWindow ().max.y - dy)
    {
        throw ArgExc ("different data windows");
    }

    DeepImageLevel::ConstIterator i1 = level1.begin ();
    DeepImageLevel::ConstIterator i2 = level2.begin ();

    while (i1 != level1.end () && i2 != level2.end ())
    {
        cout << "            channel " << i1.name () << endl;

        if (i1.name () != i2.name ()) throw ArgExc ("different channel names");

        if (i1.channel ().pixelType () != i2.channel ().pixelType ())
            throw ArgExc ("different channel types");

        if (i1.channel ().xSampling () != i2.channel ().xSampling () ||
            i1.channel ().ySampling () != i2.channel ().ySampling ())
            throw ArgExc ("different channel sampling rates");

        if (i1.channel ().pLinear () != i2.channel ().pLinear ())
            throw ArgExc ("different channel types");

        switch (i1.channel ().pixelType ())
        {
            case HALF:

                verifyPixelsAreEqual<half> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            case FLOAT:

                verifyPixelsAreEqual<float> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            case UINT:

                verifyPixelsAreEqual<unsigned int> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            default: assert (false);
        }

        ++i1;
        ++i2;
    }

    if (i1 != level1.end () || i2 != level2.end ())
        throw ArgExc ("different channel lists");
}